

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameworld.cpp
# Opt level: O1

void __thiscall CGameWorld::InsertEntity(CGameWorld *this,CEntity *pEnt)

{
  int iVar1;
  
  iVar1 = pEnt->m_ObjType;
  if (this->m_apFirstEntityTypes[iVar1] != (CEntity *)0x0) {
    this->m_apFirstEntityTypes[iVar1]->m_pPrevTypeEntity = pEnt;
  }
  pEnt->m_pNextTypeEntity = this->m_apFirstEntityTypes[iVar1];
  pEnt->m_pPrevTypeEntity = (CEntity *)0x0;
  this->m_apFirstEntityTypes[iVar1] = pEnt;
  return;
}

Assistant:

void CGameWorld::InsertEntity(CEntity *pEnt)
{
#ifdef CONF_DEBUG
	for(CEntity *pCur = m_apFirstEntityTypes[pEnt->m_ObjType]; pCur; pCur = pCur->m_pNextTypeEntity)
		dbg_assert(pCur != pEnt, "err");
#endif

	// insert it
	if(m_apFirstEntityTypes[pEnt->m_ObjType])
		m_apFirstEntityTypes[pEnt->m_ObjType]->m_pPrevTypeEntity = pEnt;
	pEnt->m_pNextTypeEntity = m_apFirstEntityTypes[pEnt->m_ObjType];
	pEnt->m_pPrevTypeEntity = 0x0;
	m_apFirstEntityTypes[pEnt->m_ObjType] = pEnt;
}